

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void init_excp_7450(CPUPPCState_conflict2 *env)

{
  CPUPPCState_conflict2 *env_local;
  
  env->excp_vectors[0x40] = 0x100;
  env->excp_vectors[1] = 0x200;
  env->excp_vectors[2] = 0x300;
  env->excp_vectors[3] = 0x400;
  env->excp_vectors[4] = 0x500;
  env->excp_vectors[5] = 0x600;
  env->excp_vectors[6] = 0x700;
  env->excp_vectors[7] = 0x800;
  env->excp_vectors[10] = 0x900;
  env->excp_vectors[8] = 0xc00;
  env->excp_vectors[0x44] = 0xd00;
  env->excp_vectors[0x55] = 0xf00;
  env->excp_vectors[0x49] = 0xf20;
  env->excp_vectors[0x4e] = 0x1000;
  env->excp_vectors[0x4f] = 0x1100;
  env->excp_vectors[0x50] = 0x1200;
  env->excp_vectors[0x53] = 0x1300;
  env->excp_vectors[0x54] = 0x1400;
  env->excp_vectors[0x57] = 0x1600;
  env->hreset_vector = 0x100;
  return;
}

Assistant:

static void init_excp_7450(CPUPPCState *env)
{
    env->excp_vectors[POWERPC_EXCP_RESET]    = 0x00000100;
    env->excp_vectors[POWERPC_EXCP_MCHECK]   = 0x00000200;
    env->excp_vectors[POWERPC_EXCP_DSI]      = 0x00000300;
    env->excp_vectors[POWERPC_EXCP_ISI]      = 0x00000400;
    env->excp_vectors[POWERPC_EXCP_EXTERNAL] = 0x00000500;
    env->excp_vectors[POWERPC_EXCP_ALIGN]    = 0x00000600;
    env->excp_vectors[POWERPC_EXCP_PROGRAM]  = 0x00000700;
    env->excp_vectors[POWERPC_EXCP_FPU]      = 0x00000800;
    env->excp_vectors[POWERPC_EXCP_DECR]     = 0x00000900;
    env->excp_vectors[POWERPC_EXCP_SYSCALL]  = 0x00000C00;
    env->excp_vectors[POWERPC_EXCP_TRACE]    = 0x00000D00;
    env->excp_vectors[POWERPC_EXCP_PERFM]    = 0x00000F00;
    env->excp_vectors[POWERPC_EXCP_VPU]      = 0x00000F20;
    env->excp_vectors[POWERPC_EXCP_IFTLB]    = 0x00001000;
    env->excp_vectors[POWERPC_EXCP_DLTLB]    = 0x00001100;
    env->excp_vectors[POWERPC_EXCP_DSTLB]    = 0x00001200;
    env->excp_vectors[POWERPC_EXCP_IABR]     = 0x00001300;
    env->excp_vectors[POWERPC_EXCP_SMI]      = 0x00001400;
    env->excp_vectors[POWERPC_EXCP_VPUA]     = 0x00001600;
    /* Hardware reset vector */
    env->hreset_vector = 0x00000100UL;
}